

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O1

void m68k_op_move16_32(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  
  my_fc_handler(m68ki_cpu.s_flag | 2);
  uVar4 = m68ki_cpu.pc & m68ki_cpu.address_mask;
  m68ki_cpu.pc = m68ki_cpu.pc + 2;
  my_fc_handler(m68ki_cpu.s_flag | 2);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar4 = pmmu_translate_addr(uVar4);
  }
  uVar1 = m68k_read_memory_16(uVar4 & m68ki_cpu.address_mask);
  uVar6 = (ulong)(m68ki_cpu.ir & 7);
  uVar5 = (ulong)(uVar1 >> 0xc & 7);
  uVar4 = m68ki_cpu.dar[uVar5 + 8];
  uVar1 = m68ki_cpu.s_flag | 1;
  uVar2 = m68ki_cpu.dar[uVar6 + 8];
  my_fc_handler(m68ki_cpu.s_flag | m68ki_address_space);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar2 = pmmu_translate_addr(uVar2);
  }
  uVar3 = m68k_read_memory_32(uVar2 & m68ki_cpu.address_mask);
  my_fc_handler(uVar1);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar4 = pmmu_translate_addr(uVar4);
  }
  m68k_write_memory_32(uVar4 & m68ki_cpu.address_mask,uVar3);
  uVar4 = m68ki_cpu.dar[uVar5 + 8];
  uVar1 = m68ki_cpu.s_flag | 1;
  uVar2 = m68ki_cpu.dar[uVar6 + 8] + 4;
  my_fc_handler(m68ki_cpu.s_flag | m68ki_address_space);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar2 = pmmu_translate_addr(uVar2);
  }
  uVar4 = uVar4 + 4;
  uVar3 = m68k_read_memory_32(uVar2 & m68ki_cpu.address_mask);
  my_fc_handler(uVar1);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar4 = pmmu_translate_addr(uVar4);
  }
  m68k_write_memory_32(uVar4 & m68ki_cpu.address_mask,uVar3);
  uVar4 = m68ki_cpu.dar[uVar5 + 8];
  uVar1 = m68ki_cpu.s_flag | 1;
  uVar2 = m68ki_cpu.dar[uVar6 + 8] + 8;
  my_fc_handler(m68ki_cpu.s_flag | m68ki_address_space);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar2 = pmmu_translate_addr(uVar2);
  }
  uVar4 = uVar4 + 8;
  uVar3 = m68k_read_memory_32(uVar2 & m68ki_cpu.address_mask);
  my_fc_handler(uVar1);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar4 = pmmu_translate_addr(uVar4);
  }
  m68k_write_memory_32(uVar4 & m68ki_cpu.address_mask,uVar3);
  uVar4 = m68ki_cpu.dar[uVar5 + 8];
  uVar1 = m68ki_cpu.s_flag | 1;
  uVar2 = m68ki_cpu.dar[uVar6 + 8] + 0xc;
  my_fc_handler(m68ki_cpu.s_flag | m68ki_address_space);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar2 = pmmu_translate_addr(uVar2);
  }
  uVar4 = uVar4 + 0xc;
  uVar3 = m68k_read_memory_32(uVar2 & m68ki_cpu.address_mask);
  my_fc_handler(uVar1);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar4 = pmmu_translate_addr(uVar4);
  }
  m68k_write_memory_32(uVar4 & m68ki_cpu.address_mask,uVar3);
  m68ki_cpu.dar[uVar6 + 8] = m68ki_cpu.dar[uVar6 + 8] + 0x10;
  m68ki_cpu.dar[uVar5 + 8] = m68ki_cpu.dar[uVar5 + 8] + 0x10;
  return;
}

Assistant:

static void m68k_op_move16_32(void)
{
	uint16 w2 = OPER_I_16();
	int ax = REG_IR & 7;
	int ay = (w2 >> 12) & 7;

	m68ki_write_32(REG_A[ay],    m68ki_read_32(REG_A[ax]));
	m68ki_write_32(REG_A[ay]+4,  m68ki_read_32(REG_A[ax]+4));
	m68ki_write_32(REG_A[ay]+8,  m68ki_read_32(REG_A[ax]+8));
	m68ki_write_32(REG_A[ay]+12, m68ki_read_32(REG_A[ax]+12));

	REG_A[ax] += 16;
	REG_A[ay] += 16;
}